

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteio.hpp
# Opt level: O0

void sf2cute::InsertInt32L<std::ostream>
               (basic_ostream<char,_std::char_traits<char>_> *out,uint32_t value)

{
  uint32_t value_local;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  
  std::operator<<(out,(char)value);
  std::operator<<(out,(char)(value >> 8));
  std::operator<<(out,(char)(value >> 0x10));
  std::operator<<(out,(char)(value >> 0x18));
  return;
}

Assistant:

void InsertInt32L(Insertable & out, uint32_t value) {
  out << static_cast<char>(value & 0xff);
  out << static_cast<char>((value >> 8) & 0xff);
  out << static_cast<char>((value >> 16) & 0xff);
  out << static_cast<char>((value >> 24) & 0xff);
}